

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_storage.cpp
# Opt level: O2

void __thiscall libtorrent::aux::mmap_storage::~mmap_storage(mmap_storage *this)

{
  part_file *this_00;
  error_code ec;
  error_code local_20;
  
  local_20.val_ = 0;
  local_20.failed_ = false;
  local_20.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  this_00 = (this->m_part_file)._M_t.
            super___uniq_ptr_impl<libtorrent::aux::part_file,_std::default_delete<libtorrent::aux::part_file>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::part_file_*,_std::default_delete<libtorrent::aux::part_file>_>
            .super__Head_base<0UL,_libtorrent::aux::part_file_*,_false>._M_head_impl;
  if (this_00 != (part_file *)0x0) {
    part_file::flush_metadata(this_00,&local_20);
  }
  file_pool_impl<libtorrent::aux::file_view_entry>::release
            (this->m_pool,(storage_index_t)(this->m_storage_index).m_val);
  ::std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
             &this->m_file_created);
  ::std::unique_ptr<libtorrent::aux::part_file,_std::default_delete<libtorrent::aux::part_file>_>::
  ~unique_ptr(&this->m_part_file);
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&this->m_use_partfile);
  ::std::__cxx11::string::~string((string *)&this->m_part_file_name);
  ::std::__cxx11::string::~string((string *)&this->m_save_path);
  ::std::
  _Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  ::~_Vector_base((_Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   *)&this->m_file_priority);
  stat_cache::~stat_cache(&this->m_stat_cache);
  ::std::unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>::
  ~unique_ptr(&this->m_mapped_files);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_torrent).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<libtorrent::aux::mmap_storage>)._M_weak_this.
              super___weak_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

mmap_storage::~mmap_storage()
	{
		error_code ec;
		if (m_part_file) m_part_file->flush_metadata(ec);

		// this may be called from a different
		// thread than the disk thread
		m_pool.release(storage_index());
	}